

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readParameters.hpp
# Opt level: O3

array<njoy::ENDFtk::ControlRecord,_3UL> * __thiscall
njoy::ENDFtk::section::Type<1,451>::
readParameters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (array<njoy::ENDFtk::ControlRecord,_3UL> *__return_storage_ptr__,Type<1,451> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT)

{
  runtime_error *this_00;
  int MAT_00;
  ControlRecord line2;
  ControlRecord line1;
  ControlRecord line0;
  ControlRecord local_c0;
  ControlRecord local_90;
  ControlRecord local_60;
  
  MAT_00 = (int)lineNumber;
  ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_60,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it,(long *)end,MAT_00,1,0x1c3);
  ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_90,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it,(long *)end,MAT_00,1,0x1c3);
  ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_c0,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it,(long *)end,MAT_00,1,0x1c3);
  if (local_c0.
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl < 0) {
    tools::Log::error<char_const*>
              ("Number of descriptive records (NWD) must be greater than or equal to zero");
    tools::Log::info<char_const*,long>("See line {}",(long)(end->_M_current + -1));
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Number of descriptive records (NWD) must be greater than or equal to zero");
  }
  else {
    if (0 < (long)local_c0.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                  super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl) {
      __return_storage_ptr__->_M_elems[0].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = local_60.
                     super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                     .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Head_base<1UL,_double,_false>._M_head_impl;
      __return_storage_ptr__->_M_elems[0].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Head_base<0UL,_double,_false>._M_head_impl =
           local_60.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
      ((_Head_base<3UL,_long,_false> *)
      ((long)&__return_storage_ptr__->_M_elems[0].
              super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
              .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl =
           local_60.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl;
      __return_storage_ptr__->_M_elems[0].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl
           = local_60.
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
             _M_head_impl;
      *(_Head_base<5UL,_long,_false> *)
       &__return_storage_ptr__->_M_elems[0].
        super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
        .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> =
           local_60.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
           super__Head_base<5UL,_long,_false>._M_head_impl;
      ((_Head_base<4UL,_long,_false> *)
      ((long)&__return_storage_ptr__->_M_elems[0].
              super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
              .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl =
           local_60.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
      *(_Head_base<5UL,_long,_false> *)
       &__return_storage_ptr__->_M_elems[1].
        super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
        .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Tuple_impl<4UL,_long,_long> =
           local_90.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
           super__Head_base<5UL,_long,_false>._M_head_impl;
      ((_Head_base<4UL,_long,_false> *)
      ((long)&__return_storage_ptr__->_M_elems[1].
              super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
              .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl =
           local_90.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
      ((_Head_base<3UL,_long,_false> *)
      ((long)&__return_storage_ptr__->_M_elems[1].
              super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
              .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl =
           local_90.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl;
      __return_storage_ptr__->_M_elems[1].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl
           = local_90.
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
             _M_head_impl;
      __return_storage_ptr__->_M_elems[1].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = local_90.
                     super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                     .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Head_base<1UL,_double,_false>._M_head_impl;
      __return_storage_ptr__->_M_elems[1].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Head_base<0UL,_double,_false>._M_head_impl =
           local_90.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
      *(_Head_base<5UL,_long,_false> *)
       &__return_storage_ptr__->_M_elems[2].
        super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
        .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Tuple_impl<4UL,_long,_long> =
           local_c0.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
           super__Head_base<5UL,_long,_false>._M_head_impl;
      ((_Head_base<4UL,_long,_false> *)
      ((long)&__return_storage_ptr__->_M_elems[2].
              super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
              .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl =
           local_c0.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
      ((_Head_base<3UL,_long,_false> *)
      ((long)&__return_storage_ptr__->_M_elems[2].
              super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
              .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl =
           local_c0.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl;
      __return_storage_ptr__->_M_elems[2].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl
           = local_c0.
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
             _M_head_impl;
      __return_storage_ptr__->_M_elems[2].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = local_c0.
                     super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                     .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Head_base<1UL,_double,_false>._M_head_impl;
      __return_storage_ptr__->_M_elems[2].
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Head_base<0UL,_double,_false>._M_head_impl =
           local_c0.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
      return __return_storage_ptr__;
    }
    tools::Log::error<char_const*>
              ("Number of index records (NXC) must be greater than or equal to one");
    tools::Log::info<char_const*,long>("See line {}",(long)(end->_M_current + -1));
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Number of index records (NXC) must be greater than or equal to one");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static auto
readParameters( Iterator& it, const Iterator& end, long& lineNumber, int MAT ) {

  auto line0 = ControlRecord( it, end, lineNumber, MAT, 1, 451 );
  auto line1 = ControlRecord( it, end, lineNumber, MAT, 1, 451 );
  auto line2 = ControlRecord( it, end, lineNumber, MAT, 1, 451 );
  if ( line2.N1() < 0 ){
    Log::error( "Number of descriptive records (NWD) must be greater than or equal to zero" );
    Log::info( "See line {}", lineNumber - 1 );
    throw std::runtime_error("Number of descriptive records (NWD) must be greater than or equal to zero");
  }
  if ( line2.N2() < 1 ){
    Log::error( "Number of index records (NXC) must be greater than or equal to one" );
    Log::info( "See line {}", lineNumber - 1 );
    throw std::runtime_error("Number of index records (NXC) must be greater than or equal to one");
  }
  return std::array< ControlRecord, 3 >{{ line0, line1, line2 }};
}